

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathFrustum.h
# Opt level: O2

bool __thiscall Imath_3_2::Frustum<float>::operator==(Frustum<float> *this,Frustum<float> *src)

{
  if (((((this->_nearPlane == src->_nearPlane) && (!NAN(this->_nearPlane) && !NAN(src->_nearPlane)))
       && (this->_farPlane == src->_farPlane)) &&
      ((((!NAN(this->_farPlane) && !NAN(src->_farPlane) && (this->_left == src->_left)) &&
        ((!NAN(this->_left) && !NAN(src->_left) &&
         ((this->_right == src->_right && (!NAN(this->_right) && !NAN(src->_right))))))) &&
       (this->_top == src->_top)))) &&
     (((!NAN(this->_top) && !NAN(src->_top) && (this->_bottom == src->_bottom)) &&
      (!NAN(this->_bottom) && !NAN(src->_bottom))))) {
    return this->_orthographic == src->_orthographic;
  }
  return false;
}

Assistant:

constexpr inline bool
Frustum<T>::operator== (const Frustum<T>& src) const IMATH_NOEXCEPT
{
    return _nearPlane == src._nearPlane && _farPlane == src._farPlane &&
           _left == src._left && _right == src._right && _top == src._top &&
           _bottom == src._bottom && _orthographic == src._orthographic;
}